

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoListWnd.cpp
# Opt level: O2

void __thiscall InfoListWnd::~InfoListWnd(InfoListWnd *this)

{
  ~InfoListWnd(this);
  operator_delete(this,0x300);
  return;
}

Assistant:

InfoListWnd::~InfoListWnd()
{
    // save state
    gIlwState.activeTab = activeTab;
    gIlwState.bFilterAcOnly = acList.bFilterAcOnly;
    strncpy(gIlwState.sAcFilter, sAcFilter, sizeof(gIlwState.sAcFilter));
    gIlwState.msgLvlFilter = msgLvlFilter;
    strncpy(gIlwState.sMsgFilter, sMsgFilter, sizeof(gIlwState.sMsgFilter));

    // I am no longer
    gpILW = nullptr;
}